

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtCore.cpp
# Opt level: O3

JsErrorCode
JsCreateSharedArrayBufferWithSharedContent
          (JsSharedArrayBufferContentHandle sharedContents,JsValueRef *result)

{
  ScriptContext *scriptContext;
  JsErrorCode JVar1;
  JsrtContext *currentContext;
  SharedArrayBuffer *pSVar2;
  void *unaff_retaddr;
  undefined1 auStack_98 [8];
  TTDebuggerAbortException anon_var_0;
  undefined1 local_58 [8];
  EnterScriptObject __enterScriptObject;
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  
  currentContext = JsrtContext::GetCurrent();
  JVar1 = CheckContext(currentContext,false,false);
  if (JVar1 == JsNoError) {
    scriptContext =
         (((currentContext->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr;
    AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
              ((AutoNestedHandledExceptionType *)((long)&__enterScriptObject.library + 4),
               ExceptionType_JavascriptException|ExceptionType_OutOfMemory);
    anon_var_0.m_staticAbortMessage = (char16 *)0x0;
    anon_var_0.m_optEventTime = 0;
    anon_var_0.m_optMoveMode = 0;
    auStack_98 = (undefined1  [8])0x0;
    anon_var_0.m_abortCode = 0;
    anon_var_0._4_4_ = 0;
    Js::EnterScriptObject::EnterScriptObject
              ((EnterScriptObject *)local_58,scriptContext,(ScriptEntryExitRecord *)auStack_98,
               unaff_retaddr,&stack0x00000000,true,true,true);
    Js::ScriptContext::OnScriptStart(scriptContext,true,true);
    Js::EnterScriptObject::VerifyEnterScript((EnterScriptObject *)local_58);
    if (result == (JsValueRef *)0x0) {
      JVar1 = JsErrorNullArgument;
    }
    else {
      pSVar2 = Js::JavascriptLibrary::CreateSharedArrayBuffer
                         ((scriptContext->super_ScriptContextBase).javascriptLibrary,
                          (SharedContents *)sharedContents);
      *result = pSVar2;
      JVar1 = JsNoError;
      if (scriptContext->TTDShouldPerformRecordAction == true) {
        TTDAbort_unrecoverable_error("Why are we calling this then???");
      }
    }
    Js::EnterScriptObject::~EnterScriptObject((EnterScriptObject *)local_58);
    AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType
              ((AutoNestedHandledExceptionType *)((long)&__enterScriptObject.library + 4));
  }
  return JVar1;
}

Assistant:

CHAKRA_API JsCreateSharedArrayBufferWithSharedContent(_In_ JsSharedArrayBufferContentHandle sharedContents, _Out_ JsValueRef *result)
{
    return ContextAPIWrapper<JSRT_MAYBE_TRUE>([&](Js::ScriptContext *scriptContext, TTDRecorder& _actionEntryPopper) -> JsErrorCode {

        PARAM_NOT_NULL(result);

        Js::JavascriptLibrary* library = scriptContext->GetLibrary();
        *result = library->CreateSharedArrayBuffer((Js::SharedContents*)sharedContents);

        PERFORM_JSRT_TTD_RECORD_ACTION_RESULT(scriptContext, result);

        JS_ETW(EventWriteJSCRIPT_RECYCLER_ALLOCATE_OBJECT(*result));
        return JsNoError;
    });
}